

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-event.c
# Opt level: O2

int run_test_fs_event_start_and_close(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  int64_t eval_b;
  int64_t eval_b_2;
  uv_fs_event_t fs_event2;
  uv_fs_event_t fs_event1;
  
  loop = (uv_loop_t *)uv_default_loop();
  create_dir("watch_dir");
  iVar1 = uv_fs_event_init(loop,&fs_event1);
  fs_event2.data = (void *)(long)iVar1;
  if (fs_event2.data == (void *)0x0) {
    iVar1 = uv_fs_event_start(&fs_event1,fs_event_cb_dir,"watch_dir",0);
    fs_event2.data = (void *)(long)iVar1;
    if (fs_event2.data == (void *)0x0) {
      iVar1 = uv_fs_event_init(loop,&fs_event2);
      eval_b = (int64_t)iVar1;
      eval_b_2 = 0;
      if ((void *)eval_b == (void *)0x0) {
        iVar1 = uv_fs_event_start(&fs_event2,fs_event_cb_dir,"watch_dir",0);
        eval_b = (int64_t)iVar1;
        eval_b_2 = 0;
        if ((void *)eval_b == (void *)0x0) {
          uv_close(&fs_event2,close_cb);
          uv_close(&fs_event1,close_cb);
          uv_run(loop,0);
          eval_b = 2;
          eval_b_2 = (int64_t)close_cb_called;
          if (eval_b_2 == 2) {
            remove("watch_dir/");
            close_loop(loop);
            eval_b = 0;
            iVar1 = uv_loop_close(loop);
            eval_b_2 = (int64_t)iVar1;
            if (eval_b_2 == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(loop)";
            pcVar3 = "0";
            uVar2 = 0x400;
          }
          else {
            pcVar4 = "close_cb_called";
            pcVar3 = "2";
            uVar2 = 0x3fd;
          }
        }
        else {
          pcVar4 = "0";
          pcVar3 = "r";
          uVar2 = 0x3f6;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x3f4;
      }
      goto LAB_001220be;
    }
    uVar2 = 0x3f1;
  }
  else {
    uVar2 = 0x3ef;
  }
  pcVar4 = "0";
  pcVar3 = "r";
  eval_b_2 = 0;
  eval_b = (int64_t)fs_event2.data;
LAB_001220be:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-fs-event.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_b,"==",eval_b_2);
  abort();
}

Assistant:

TEST_IMPL(fs_event_start_and_close) {
#if defined(NO_FS_EVENTS)
  RETURN_SKIP(NO_FS_EVENTS);
#endif
  uv_loop_t* loop;
  uv_fs_event_t fs_event1;
  uv_fs_event_t fs_event2;
  int r;

  loop = uv_default_loop();

  create_dir("watch_dir");

  r = uv_fs_event_init(loop, &fs_event1);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event1, fs_event_cb_dir, "watch_dir", 0);
  ASSERT_OK(r);

  r = uv_fs_event_init(loop, &fs_event2);
  ASSERT_OK(r);
  r = uv_fs_event_start(&fs_event2, fs_event_cb_dir, "watch_dir", 0);
  ASSERT_OK(r);

  uv_close((uv_handle_t*) &fs_event2, close_cb);
  uv_close((uv_handle_t*) &fs_event1, close_cb);

  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(2, close_cb_called);

  remove("watch_dir/");
  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}